

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O0

void Aig_MmFixedRestart(Aig_MmFixed_t *p)

{
  long *local_20;
  char *pTemp;
  int i;
  Aig_MmFixed_t *p_local;
  
  if (p->nChunks != 0) {
    for (pTemp._4_4_ = 1; pTemp._4_4_ < p->nChunks; pTemp._4_4_ = pTemp._4_4_ + 1) {
      if (p->pChunks[pTemp._4_4_] != (char *)0x0) {
        free(p->pChunks[pTemp._4_4_]);
        p->pChunks[pTemp._4_4_] = (char *)0x0;
      }
    }
    p->nChunks = 1;
    local_20 = (long *)*p->pChunks;
    for (pTemp._4_4_ = 1; pTemp._4_4_ < p->nChunkSize; pTemp._4_4_ = pTemp._4_4_ + 1) {
      *local_20 = (long)local_20 + (long)p->nEntrySize;
      local_20 = (long *)((long)local_20 + (long)p->nEntrySize);
    }
    *local_20 = 0;
    p->pEntriesFree = *p->pChunks;
    p->nMemoryAlloc = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed = 0;
  }
  return;
}

Assistant:

void Aig_MmFixedRestart( Aig_MmFixed_t * p )
{
    int i;
    char * pTemp;
    if ( p->nChunks == 0 )
        return;
    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks = 1;
    // transform these entries into a linked list
    pTemp = p->pChunks[0];
    for ( i = 1; i < p->nChunkSize; i++ )
    {
        *((char **)pTemp) = pTemp + p->nEntrySize;
        pTemp += p->nEntrySize;
    }
    // set the last link
    *((char **)pTemp) = NULL;
    // set the free entry list
    p->pEntriesFree  = p->pChunks[0];
    // set the correct statistics
    p->nMemoryAlloc  = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed   = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed  = 0;
}